

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

void __thiscall phosg::cannot_open_file::cannot_open_file(cannot_open_file *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint *puVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int error;
  undefined8 uVar6;
  size_type *local_98;
  size_type local_90;
  size_type local_88;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,"can\'t open file ",filename);
  pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38
                      ,": ");
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar5) {
    local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_78._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  puVar4 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_58,(phosg *)(ulong)*puVar4,error);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    uVar6 = local_78.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_58._M_string_length + local_78._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar6 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_78._M_string_length <= (ulong)uVar6) {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_58,0,0,local_78._M_dataplus._M_p,local_78._M_string_length);
      goto LAB_0011527c;
    }
  }
  pbVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_78,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_0011527c:
  local_98 = &local_88;
  psVar2 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2 == paVar5) {
    local_88 = paVar5->_M_allocated_capacity;
    uStack_80 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_88 = paVar5->_M_allocated_capacity;
    local_98 = psVar2;
  }
  local_90 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this->_vptr_cannot_open_file = (_func_int **)0x12bb78;
  *(undefined8 *)&this->field_0x10 = 0x12bba8;
  this->error = *puVar4;
  return;
}

Assistant:

cannot_open_file::cannot_open_file(const string& filename)
    : runtime_error("can\'t open file " + filename + ": " + string_for_error(errno)),
      error(errno) {}